

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm.cpp
# Opt level: O2

int __thiscall ncnn::GroupNorm::forward_inplace(GroupNorm *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  int i;
  int channels;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int q;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  Mat bottom_top_blob_g;
  float local_118;
  float local_110;
  float local_10c;
  float local_108;
  Mat local_c0;
  Mat local_78;
  
  uVar9 = bottom_top_blob->h * bottom_top_blob->w;
  iVar7 = this->group;
  uVar3 = (long)this->channels / (long)iVar7;
  channels = (int)uVar3;
  lVar6 = 0;
  uVar1 = uVar9;
  if ((int)uVar9 < 1) {
    uVar1 = 0;
  }
  uVar10 = (ulong)uVar1;
  uVar8 = 0;
  if (0 < channels) {
    uVar8 = uVar3 & 0xffffffff;
  }
  fVar12 = 1.0 / (float)(int)(channels * uVar9);
  auVar14 = ZEXT416((uint)fVar12);
  for (; lVar6 < iVar7; lVar6 = lVar6 + 1) {
    Mat::channel_range(&local_c0,bottom_top_blob,(int)(lVar6 * channels),channels);
    local_108 = 0.0;
    for (iVar7 = 0; iVar7 != (int)uVar8; iVar7 = iVar7 + 1) {
      Mat::channel(&local_78,&local_c0,iVar7);
      pvVar2 = local_78.data;
      Mat::~Mat(&local_78);
      for (uVar3 = 0; uVar10 != uVar3; uVar3 = uVar3 + 1) {
        local_108 = local_108 + *(float *)((long)pvVar2 + uVar3 * 4);
      }
    }
    local_108 = local_108 * fVar12;
    local_118 = 0.0;
    for (iVar7 = 0; iVar7 != (int)uVar8; iVar7 = iVar7 + 1) {
      Mat::channel(&local_78,&local_c0,iVar7);
      pvVar2 = local_78.data;
      Mat::~Mat(&local_78);
      for (uVar3 = 0; uVar10 != uVar3; uVar3 = uVar3 + 1) {
        fVar11 = *(float *)((long)pvVar2 + uVar3 * 4) - local_108;
        local_118 = local_118 + fVar11 * fVar11;
        auVar14 = ZEXT416((uint)local_118);
      }
    }
    for (uVar3 = 0; uVar3 != uVar8; uVar3 = uVar3 + 1) {
      if (this->affine == 0) {
        fVar11 = this->eps + local_118 * fVar12;
        auVar14 = rsqrtss(auVar14,ZEXT416((uint)fVar11));
        fVar13 = auVar14._0_4_;
        local_10c = fVar13 * -0.5 * (fVar11 * fVar13 * fVar13 + -3.0);
        auVar14._0_4_ = local_10c * -local_108;
        local_110 = auVar14._0_4_;
      }
      else {
        lVar4 = lVar6 * channels + uVar3;
        fVar11 = this->eps + local_118 * fVar12;
        auVar14 = rsqrtss(auVar14,ZEXT416((uint)fVar11));
        fVar13 = auVar14._0_4_;
        auVar14._0_4_ =
             fVar13 * -0.5 * (fVar11 * fVar13 * fVar13 + -3.0) *
             *(float *)((long)(this->gamma_data).data + lVar4 * 4);
        local_110 = *(float *)((long)(this->beta_data).data + lVar4 * 4) - auVar14._0_4_ * local_108
        ;
        local_10c = auVar14._0_4_;
      }
      Mat::channel(&local_78,&local_c0,(int)uVar3);
      pvVar2 = local_78.data;
      Mat::~Mat(&local_78);
      for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
        *(float *)((long)pvVar2 + uVar5 * 4) =
             *(float *)((long)pvVar2 + uVar5 * 4) * local_10c + local_110;
      }
    }
    Mat::~Mat(&local_c0);
    iVar7 = this->group;
  }
  return 0;
}

Assistant:

int GroupNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int size = w * h;

    int channels_per_group = channels / group;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);

        // mean and var
        float sum = 0.f;
        for (int q = 0; q < channels_per_group; q++)
        {
            const float* ptr = bottom_top_blob_g.channel(q);
            for (int i = 0; i < size; i++)
            {
                sum += ptr[i];
            }
        }
        float mean = sum / (channels_per_group * size);

        float sqsum = 0.f;
        for (int q = 0; q < channels_per_group; q++)
        {
            const float* ptr = bottom_top_blob_g.channel(q);
            for (int i = 0; i < size; i++)
            {
                float tmp = ptr[i] - mean;
                sqsum += tmp * tmp;
            }
        }
        float var = sqsum / (channels_per_group * size);

        for (int q = 0; q < channels_per_group; q++)
        {
            float a;
            float b;
            if (affine)
            {
                float gamma = gamma_data[g * channels_per_group + q];
                float beta = beta_data[g * channels_per_group + q];

                a = static_cast<float>(gamma / sqrt(var + eps));
                b = -mean * a + beta;
            }
            else
            {
                a = static_cast<float>(1.f / (sqrt(var + eps)));
                b = -mean * a;
            }

            float* ptr = bottom_top_blob_g.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * a + b;
            }
        }
    }

    return 0;
}